

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O0

void * __thiscall cs::method_base::operator_new(size_t size)

{
  void *pvVar1;
  ulong in_RDI;
  void *ptr;
  
  pvVar1 = ::operator_new(in_RDI);
  garbage_collector<cs::method_base>::add((garbage_collector<cs::method_base> *)size,ptr);
  return pvVar1;
}

Assistant:

static void *operator new(std::size_t size)
		{
			void *ptr = ::operator new(size);
			gc.add(ptr);
			return ptr;
		}